

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

void __thiscall
boost::ext::ut::v1_1_8::runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>
::on<void(*)(),boost::ext::ut::v1_1_8::none>
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16> *this,
          test<void_(*)(),_boost::ext::ut::v1_1_8::none> *test)

{
  runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16> *prVar1;
  long lVar2;
  pointer psVar3;
  string_view *psVar4;
  test_begin test_begin;
  test_run test_run;
  test_skip test_skip;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  test_end tVar9;
  bool bVar10;
  uint uVar11;
  ostream *poVar12;
  iterator __begin0;
  pointer psVar13;
  char *pcVar14;
  basic_string_view<char,_std::char_traits<char>_> *ftag;
  string_view *psVar15;
  ulong uVar16;
  iterator __end0;
  bool bVar17;
  string_view pattern;
  string_view input;
  string_view input_00;
  undefined4 uStack_7c;
  
  lVar2 = *(long *)(this + 0x200);
  pcVar14 = (test->name).data_;
  *(unsigned_long *)(this + lVar2 * 0x10 + 0x218) = (test->name).size_;
  *(char **)(this + lVar2 * 0x10 + 0x220) = pcVar14;
  psVar13 = (test->tag).
            super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (test->tag).
           super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar17 = psVar13 == psVar3;
  for (; psVar13 != psVar3; psVar13 = psVar13 + 1) {
    pattern._M_str = "skip";
    pattern._M_len = 4;
    input._M_str = psVar13->data_;
    input._M_len = psVar13->size_;
    bVar10 = utility::is_match(input,pattern);
    if (bVar10) goto LAB_0010b7dc;
    psVar15 = *(string_view **)(this + 0x330);
    psVar4 = *(string_view **)(this + 0x338);
    do {
      if (psVar15 == psVar4) goto LAB_0010b752;
      input_00._M_str = psVar13->data_;
      input_00._M_len = psVar13->size_;
      bVar10 = utility::is_match(input_00,*psVar15);
      psVar15 = psVar15 + 1;
    } while (!bVar10);
    bVar17 = true;
LAB_0010b752:
  }
  if (bVar17) {
    bVar17 = filter::operator()(this + 0x318,*(size_t *)(this + 0x200),
                                (array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL>
                                 *)(this + 0x218));
    if (bVar17) {
      lVar2 = *(long *)(this + 0x200);
      *(long *)(this + 0x200) = lVar2 + 1;
      if (lVar2 == 0) {
        uVar5 = (test->type).data_;
        uVar6 = (test->type).size_;
        test_begin.type.size_ = uVar6;
        test_begin.type.data_ = (char *)uVar5;
        uVar7 = (test->name).data_;
        uVar8 = (test->name).size_;
        test_begin.name.size_ = uVar8;
        test_begin.name.data_ = (char *)uVar7;
        test_begin.location._12_4_ = uStack_7c;
        test_begin.location.line_ = (test->location).line_;
        test_begin.location.file_ = (test->location).file_;
        reporter<boost::ext::ut::v1_1_8::printer>::on
                  ((reporter<boost::ext::ut::v1_1_8::printer> *)this,test_begin);
      }
      else {
        test_run.type = test->type;
        test_run.name = test->name;
        reporter<boost::ext::ut::v1_1_8::printer>::on
                  ((reporter<boost::ext::ut::v1_1_8::printer> *)this,test_run);
      }
      if (this[0x348] ==
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>)0x1) {
        for (uVar11 = 0; uVar16 = (ulong)uVar11, uVar16 < *(ulong *)(this + 0x200);
            uVar11 = uVar11 + 1) {
          pcVar14 = ".";
          if (uVar16 == 0) {
            pcVar14 = "";
          }
          poVar12 = std::operator<<((ostream *)&std::cout,pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,*(char **)(this + uVar16 * 0x10 + 0x220),
                     *(long *)(this + 0x218 + uVar16 * 0x10));
        }
        std::operator<<((ostream *)&std::cout,'\n');
      }
      (*test->run)();
      prVar1 = this + 0x200;
      *(long *)prVar1 = *(long *)prVar1 + -1;
      if (*(long *)prVar1 == 0) {
        tVar9.type = test->type;
        tVar9.name = test->name;
        reporter<boost::ext::ut::v1_1_8::printer>::on
                  ((reporter<boost::ext::ut::v1_1_8::printer> *)this,tVar9);
      }
    }
  }
  else {
LAB_0010b7dc:
    test_skip.type = test->type;
    test_skip.name = test->name;
    reporter<boost::ext::ut::v1_1_8::printer>::on
              ((reporter<boost::ext::ut::v1_1_8::printer> *)this,test_skip);
  }
  return;
}

Assistant:

auto on(events::test<Ts...> test) {
      path_[level_] = test.name;

      auto execute = std::empty(test.tag);
      for (const auto& tag : test.tag) {
        if (utility::is_match(tag, "skip")) {
          on(events::skip<>{.type = test.type, .name = test.name});
          return;
        }

        for (const auto& ftag : tag_) {
          if (utility::is_match(tag, ftag)) {
            execute = true;
            break;
          }
        }
      }

      if (not execute) {
        on(events::skip<>{.type = test.type, .name = test.name});
        return;
      }

      if (filter_(level_, path_)) {
        if (not level_++) {
          reporter_.on(events::test_begin{
              .type = test.type, .name = test.name, .location = test.location});
        } else {
          reporter_.on(events::test_run{.type = test.type, .name = test.name});
        }

        if (dry_run_) {
          for (auto i = 0u; i < level_; ++i) {
            std::cout << (i ? "." : "") << path_[i];
          }
          std::cout << '\n';
        }

#if defined(__cpp_exceptions)
        try {
#endif
          test();
#if defined(__cpp_exceptions)
        } catch (const events::fatal_assertion&) {
        } catch (const std::exception& exception) {
          ++fails_;
          reporter_.on(events::exception{exception.what()});
        } catch (...) {
          ++fails_;
          reporter_.on(events::exception{"Unknown exception"});
        }
#endif

        if (not--level_) {
          reporter_.on(events::test_end{.type = test.type, .name = test.name});
        }
      }
    }